

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O0

void __thiscall llbuild::core::BuildEngine::dumpGraphToFile(BuildEngine *this,string *path)

{
  string *path_local;
  BuildEngine *this_local;
  
  anon_unknown.dwarf_12f2cc::BuildEngineImpl::dumpGraphToFile((BuildEngineImpl *)this->impl,path);
  return;
}

Assistant:

void BuildEngine::dumpGraphToFile(const std::string& path) {
  static_cast<BuildEngineImpl*>(impl)->dumpGraphToFile(path);
}